

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void INT_CManager_close(CManager_conflict cm)

{
  void **ppvVar1;
  CMControlList cl;
  pthread_t pVar2;
  FILE *pFVar3;
  CMPollFunc *pp_Var4;
  int iVar5;
  __pid_t _Var6;
  pthread_t pVar7;
  func_entry *pfVar8;
  func_entry *pfVar9;
  ulong uVar10;
  func_entry *shutdown_functions;
  timespec ts;
  
  cl = cm->control_list;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
    if (iVar5 != 0) goto LAB_0011850d;
  }
  else if (CMtrace_val[7] != 0) {
LAB_0011850d:
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"CManager %p closing, ref count %d\n",cm,
            (ulong)(uint)cm->reference_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,
            "CMControlList close CL=%p current reference count will be %d, sdp = %p\n",cl,
            (ulong)(cl->cl_reference_count - 1),cl->select_data);
  }
  fflush((FILE *)cm->CMTrace_file);
  cl->cl_reference_count = cl->cl_reference_count + -1;
  cl->closed = 1;
  ppvVar1 = &cl->select_data;
  (*cl->stop_select)(&CMstatic_trans_svcs,ppvVar1);
  if ((((0 < cl->has_thread) && (pVar2 = cl->server_thread, pVar7 = pthread_self(), pVar2 != pVar7))
      && ((*cl->wake_select)(&CMstatic_trans_svcs,ppvVar1), 0 < cl->has_thread)) &&
     (cl->server_thread != pVar7)) {
    (*cl->stop_select)(&CMstatic_trans_svcs,ppvVar1);
    (*cl->wake_select)(&CMstatic_trans_svcs,ppvVar1);
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0x57c);
    pthread_join(cl->server_thread,(void **)&ts);
    IntCManager_lock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0x57e);
    cl->has_thread = 0;
  }
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"CMControlList CL=%p is closed\n",cl);
  }
  fflush((FILE *)cm->CMTrace_file);
  while (cm->connection_count != 0) {
    iVar5 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar3 = (FILE *)cm->CMTrace_file;
        _Var6 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CManager in close, closing connection %p , ref count %d\n",
              *cm->connections,(ulong)(uint)(*cm->connections)->conn_ref_count);
    }
    fflush((FILE *)cm->CMTrace_file);
    internal_connection_close(*cm->connections);
    INT_CMConnection_failed(*cm->connections);
  }
  pfVar9 = cm->shutdown_functions;
  if (pfVar9 != (func_entry *)0x0) {
    uVar10 = 0;
    for (; pfVar9->func != (CMPollFunc)0x0; pfVar9 = pfVar9 + 1) {
      if (pfVar9->task_type == 1) {
        iVar5 = CMtrace_val[7];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(cm,CMFreeVerbose);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar3 = (FILE *)cm->CMTrace_file;
            _Var6 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"CManager calling shutdown function SHUTDOWN %d, %p\n",
                  uVar10,pfVar9->func);
        }
        fflush((FILE *)cm->CMTrace_file);
        (*pfVar9->func)(cm,pfVar9->client_data);
        pfVar9->task_type = 0;
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    }
  }
  cm->reference_count = cm->reference_count + -1;
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"CManager %p ref count now %d\n",cm,
            (ulong)(uint)cm->reference_count);
  }
  fflush((FILE *)cm->CMTrace_file);
  if (cm->reference_count != 0) {
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0x3de);
    return;
  }
  pfVar9 = cm->shutdown_functions;
  if (pfVar9 != (func_entry *)0x0) {
    cm->shutdown_functions = (func_entry *)0x0;
    uVar10 = 0xfffffffffffffffe;
    pfVar8 = pfVar9;
    do {
      uVar10 = uVar10 + 1;
      pp_Var4 = &pfVar8->func;
      pfVar8 = pfVar8 + 1;
    } while (*pp_Var4 != (CMPollFunc)0x0);
    for (; uVar10 != 0xffffffffffffffff && -1 < (long)(uVar10 + 1); uVar10 = uVar10 - 1) {
      if (pfVar9[uVar10 & 0xffffffff].task_type == 2) {
        pfVar8 = pfVar9 + (uVar10 & 0xffffffff);
        iVar5 = CMtrace_val[7];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar5 = CMtrace_init(cm,CMFreeVerbose);
        }
        if (iVar5 != 0) {
          if (CMtrace_PID != 0) {
            pFVar3 = (FILE *)cm->CMTrace_file;
            _Var6 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,"CManager calling shutdown function FREE %d, %p\n",
                  uVar10 & 0xffffffff,pfVar8->func);
        }
        fflush((FILE *)cm->CMTrace_file);
        (*pfVar8->func)(cm,pfVar8->client_data);
        pfVar8->func = (CMPollFunc)0x0;
      }
    }
    INT_CMfree(pfVar9);
  }
  iVar5 = CMtrace_val[7];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,CMFreeVerbose);
  }
  if (iVar5 != 0) {
    if (CMtrace_PID != 0) {
      pFVar3 = (FILE *)cm->CMTrace_file;
      _Var6 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar3,"P%lxT%lx - ",(long)_Var6,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Freeing CManager %p\n",cm);
  }
  fflush((FILE *)cm->CMTrace_file);
  cl->free_reference_count = 0;
  if (CMtrace_val[7] != 0) {
    fprintf((FILE *)cm->CMTrace_file,"CMControlList_free, %p, ref count now %d\n",cl,0);
    if (cl->free_reference_count != 0) goto LAB_00118d60;
    if (CMtrace_val[7] != 0) {
      fprintf((FILE *)cm->CMTrace_file,"CMControlList_free freeing %p\n",cl);
    }
  }
  if (cl->polling_function_list != (func_entry *)0x0) {
    INT_CMfree(cl->polling_function_list);
  }
  pthread_mutex_destroy((pthread_mutex_t *)&cl->list_mutex);
  internal_condition_free(cl);
  INT_CMfree(cl);
LAB_00118d60:
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0x3db);
  CManager_free(cm);
  return;
}

Assistant:

extern void
 INT_CManager_close(CManager cm)
 {
     CMControlList cl = cm->control_list;

     CMtrace_out(cm, CMFreeVerbose, "CManager %p closing, ref count %d\n", cm,
		 cm->reference_count);

     CMtrace_out(cm, CMFreeVerbose, "CMControlList close CL=%p current reference count will be %d, sdp = %p\n", 
		 cl, cl->cl_reference_count - 1, cl->select_data);
     INT_CMControlList_close(cl, cm);
     CMtrace_out(cm, CMFreeVerbose, "CMControlList CL=%p is closed\n", cl);

     while (cm->connection_count != 0) {
	 /* connections are moved down as they are closed... */
	 CMtrace_out(cm, CMFreeVerbose, "CManager in close, closing connection %p , ref count %d\n", cm->connections[0],
		     cm->connections[0]->conn_ref_count);
	 internal_connection_close(cm->connections[0]);
	 INT_CMConnection_failed(cm->connections[0]);
     }

     if (cm->shutdown_functions != NULL) {
	 func_entry *shutdown_functions = cm->shutdown_functions;
	 int i = 0;

	 while (shutdown_functions[i].func != NULL) {
	     if (shutdown_functions[i].task_type == SHUTDOWN_TASK) {
		 CMtrace_out(cm, CMFreeVerbose, "CManager calling shutdown function SHUTDOWN %d, %p\n", i, shutdown_functions[i].func);
		 shutdown_functions[i].func(cm, shutdown_functions[i].client_data);
		 shutdown_functions[i].task_type = NO_TASK;
	     }
	     i++;
	 }
     }
     cm->reference_count--;
     CMtrace_out(cm, CMFreeVerbose, "CManager %p ref count now %d\n", 
		 cm, cm->reference_count);
     if (cm->reference_count == 0) {
	 if (cm->shutdown_functions != NULL) {
	     int i = 0;
	     func_entry *shutdown_functions = cm->shutdown_functions;
	     cm->shutdown_functions = NULL;

	     while (shutdown_functions[i].func != NULL) {
		 i++;
	     }
	     i--;
	     for ( ; i >= 0; i--) {
		 if (shutdown_functions[i].task_type == FREE_TASK) {
		     CMtrace_out(cm, CMFreeVerbose, "CManager calling shutdown function FREE %d, %p\n", i, shutdown_functions[i].func);
		     shutdown_functions[i].func(cm, shutdown_functions[i].client_data);
		     shutdown_functions[i].func = NULL;
		 }
	     }
	     INT_CMfree(shutdown_functions);
	 }
	 CMtrace_out(cm, CMFreeVerbose, "Freeing CManager %p\n", cm);
	 cl->free_reference_count = 1;
	 CMControlList_free(cm, cl);
	 CManager_unlock(cm);
	 CManager_free(cm);
     } else {
	 CManager_unlock(cm);
     }
 }